

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O0

void FT_Outline_Reverse(FT_Outline *outline)

{
  char cVar1;
  FT_Pos FVar2;
  FT_Pos FVar3;
  int iVar4;
  char *pcStack_50;
  char swap_1;
  char *q_1;
  char *p_1;
  FT_Vector swap;
  FT_Vector *q;
  FT_Vector *p;
  int local_18;
  FT_Int last;
  FT_Int first;
  FT_UShort n;
  FT_Outline *outline_local;
  
  if (outline != (FT_Outline *)0x0) {
    local_18 = 0;
    for (last._2_2_ = 0; (int)(uint)last._2_2_ < (int)outline->n_contours;
        last._2_2_ = last._2_2_ + 1) {
      iVar4 = (int)outline->contours[last._2_2_];
      swap.y = (FT_Pos)(outline->points + iVar4);
      for (q = outline->points + local_18; q < (ulong)swap.y; q = q + 1) {
        FVar2 = q->x;
        FVar3 = q->y;
        q->x = *(FT_Pos *)swap.y;
        q->y = *(FT_Pos *)(swap.y + 8);
        *(FT_Pos *)swap.y = FVar2;
        *(FT_Pos *)(swap.y + 8) = FVar3;
        swap.y = swap.y + -0x10;
      }
      pcStack_50 = outline->tags + iVar4;
      for (q_1 = outline->tags + local_18; q_1 < pcStack_50; q_1 = q_1 + 1) {
        cVar1 = *q_1;
        *q_1 = *pcStack_50;
        *pcStack_50 = cVar1;
        pcStack_50 = pcStack_50 + -1;
      }
      local_18 = iVar4 + 1;
    }
    outline->flags = outline->flags ^ 4;
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Outline_Reverse( FT_Outline*  outline )
  {
    FT_UShort  n;
    FT_Int     first, last;


    if ( !outline )
      return;

    first = 0;

    for ( n = 0; n < outline->n_contours; n++ )
    {
      last  = outline->contours[n];

      /* reverse point table */
      {
        FT_Vector*  p = outline->points + first;
        FT_Vector*  q = outline->points + last;
        FT_Vector   swap;


        while ( p < q )
        {
          swap = *p;
          *p   = *q;
          *q   = swap;
          p++;
          q--;
        }
      }

      /* reverse tags table */
      {
        char*  p = outline->tags + first;
        char*  q = outline->tags + last;


        while ( p < q )
        {
          char  swap;


          swap = *p;
          *p   = *q;
          *q   = swap;
          p++;
          q--;
        }
      }

      first = last + 1;
    }

    outline->flags ^= FT_OUTLINE_REVERSE_FILL;
  }